

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Vec_Int_t * Gia_ManDetectFullAdders(Gia_Man_t *p,int fVerbose,Vec_Int_t **pvCutsXor2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *vFadds;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *vCutsXor;
  Vec_Int_t **pvCutsXor2_local;
  Gia_Man_t *pGStack_10;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  vCutsXor = (Vec_Int_t *)pvCutsXor2;
  pvCutsXor2_local._4_4_ = fVerbose;
  pGStack_10 = p;
  Dtc_ManComputeCuts(p,pvCutsXor2,&vCutsMaj,&vFadds,fVerbose);
  piVar4 = Vec_IntArray(vCutsMaj);
  iVar1 = Vec_IntSize(vCutsMaj);
  qsort(piVar4,(long)(iVar1 / 4),0x10,Dtc_ManCompare);
  piVar4 = Vec_IntArray(vFadds);
  iVar1 = Vec_IntSize(vFadds);
  qsort(piVar4,(long)(iVar1 / 4),0x10,Dtc_ManCompare);
  p_00 = Dtc_ManFindCommonCuts(pGStack_10,vCutsMaj,vFadds);
  piVar4 = Vec_IntArray(p_00);
  iVar1 = Vec_IntSize(p_00);
  qsort(piVar4,(long)(iVar1 / 5),0x14,Dtc_ManCompare2);
  if (pvCutsXor2_local._4_4_ != 0) {
    iVar1 = Vec_IntSize(vCutsMaj);
    iVar2 = Vec_IntSize(vFadds);
    iVar3 = Vec_IntSize(p_00);
    printf("XOR3 cuts = %d.  MAJ cuts = %d.  Full-adders = %d.\n",(ulong)(uint)(iVar1 / 4),
           (ulong)(uint)(iVar2 / 4),(long)iVar3 / 5 & 0xffffffff);
  }
  if (pvCutsXor2_local._4_4_ != 0) {
    Dtc_ManPrintFadds(p_00);
  }
  Vec_IntFree(vCutsMaj);
  Vec_IntFree(vFadds);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManDetectFullAdders( Gia_Man_t * p, int fVerbose, Vec_Int_t ** pvCutsXor2 )
{
    Vec_Int_t * vCutsXor, * vCutsMaj, * vFadds;
    Dtc_ManComputeCuts( p, pvCutsXor2, &vCutsXor, &vCutsMaj, fVerbose );
    qsort( Vec_IntArray(vCutsXor), (size_t)(Vec_IntSize(vCutsXor)/4), 16, (int (*)(const void *, const void *))Dtc_ManCompare );
    qsort( Vec_IntArray(vCutsMaj), (size_t)(Vec_IntSize(vCutsMaj)/4), 16, (int (*)(const void *, const void *))Dtc_ManCompare );
    vFadds = Dtc_ManFindCommonCuts( p, vCutsXor, vCutsMaj );
    qsort( Vec_IntArray(vFadds), (size_t)(Vec_IntSize(vFadds)/5), 20, (int (*)(const void *, const void *))Dtc_ManCompare2 );
    if ( fVerbose )
        printf( "XOR3 cuts = %d.  MAJ cuts = %d.  Full-adders = %d.\n", Vec_IntSize(vCutsXor)/4, Vec_IntSize(vCutsMaj)/4, Vec_IntSize(vFadds)/5 );
    if ( fVerbose )
        Dtc_ManPrintFadds( vFadds );
    Vec_IntFree( vCutsXor );
    Vec_IntFree( vCutsMaj );
    return vFadds;
}